

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O3

nng_err nni_http_handler_init_static
                  (nni_http_handler **hpp,char *uri,void *data,size_t size,char *ctype)

{
  nng_err nVar1;
  undefined8 *data_00;
  char *pcVar2;
  void *__dest;
  nni_http_handler *local_48;
  nni_http_handler *h;
  nni_http_handler **local_38;
  
  h = (nni_http_handler *)uri;
  local_38 = hpp;
  data_00 = (undefined8 *)nni_zalloc(0x18);
  nVar1 = NNG_ENOMEM;
  if (data_00 == (undefined8 *)0x0) {
    return NNG_ENOMEM;
  }
  pcVar2 = nni_strdup(ctype);
  data_00[2] = pcVar2;
  if (pcVar2 != (char *)0x0) {
    if (size == 0) {
      __dest = (void *)*data_00;
    }
    else {
      __dest = nni_alloc(size);
      *data_00 = __dest;
      if (__dest == (void *)0x0) goto LAB_00137b7b;
    }
    data_00[1] = size;
    memcpy(__dest,data,size);
    nVar1 = nni_http_handler_init(&local_48,(char *)h,http_handle_static);
    if (nVar1 == NNG_OK) {
      nni_http_handler_set_data(local_48,data_00,http_static_free);
      local_48->getbody = true;
      local_48->maxbody = 0;
      *local_38 = local_48;
      return NNG_OK;
    }
  }
LAB_00137b7b:
  http_static_free(data_00);
  return nVar1;
}

Assistant:

nng_err
nni_http_handler_init_static(nni_http_handler **hpp, const char *uri,
    const void *data, size_t size, const char *ctype)
{
	nni_http_handler *h;
	nng_err           rv;
	http_static      *hs;

	if ((hs = NNI_ALLOC_STRUCT(hs)) == NULL) {
		return (NNG_ENOMEM);
	}
	if (((hs->ctype = nni_strdup(ctype)) == NULL) ||
	    ((size > 0) && ((hs->data = nni_alloc(size)) == NULL))) {
		http_static_free(hs);
		return (NNG_ENOMEM);
	}
	hs->size = size;
	memcpy(hs->data, data, size);

	if ((rv = nni_http_handler_init(&h, uri, http_handle_static)) != 0) {
		http_static_free(hs);
		return (rv);
	}

	nni_http_handler_set_data(h, hs, http_static_free);

	// We don't permit a body for getting static data.
	nni_http_handler_collect_body(h, true, 0);

	*hpp = h;
	return (NNG_OK);
}